

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_3,_3,_0,_3,_3> *dst,
               Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *src,assign_op<double,_double> *func
               )

{
  SrcEvaluatorType func_00;
  Matrix<double,_3,_3,_0,_3,_3> *dstExpr;
  undefined1 local_60 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> local_28;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *src_local;
  Matrix<double,_3,_3,_0,_3,_3> *dst_local;
  
  srcEvaluator.
  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
  data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
          )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )func;
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::evaluator(&local_28,src);
  resize_if_allowed<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                     .m_argImpl.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     .m_d.data);
  evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::evaluator
            ((evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator;
  dstExpr = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_60,(DstEvaluatorType *)&kernel.m_dstExpr,&local_28,
             (assign_op<double,_double> *)
             func_00.
             super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
             .m_argImpl.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
             data,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_60);
  evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::~evaluator(&local_28);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}